

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryReporterPluginTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MemoryReporterPlugin_endOfaTestGroupWillReportSo_TestShell::createTest
          (TEST_MemoryReporterPlugin_endOfaTestGroupWillReportSo_TestShell *this)

{
  TEST_MemoryReporterPlugin_endOfaTestGroupWillReportSo_Test *this_00;
  
  this_00 = (TEST_MemoryReporterPlugin_endOfaTestGroupWillReportSo_Test *)
            operator_new(0x58,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MemoryReporterPluginTest.cpp"
                         ,0x102);
  TEST_MemoryReporterPlugin_endOfaTestGroupWillReportSo_Test::
  TEST_MemoryReporterPlugin_endOfaTestGroupWillReportSo_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MemoryReporterPlugin, endOfaTestGroupWillReportSo)
{
    UtestForMemoryReportingPlugingTest fourthTest("differentGroupName", NULLPTR);
    UtestForMemoryReportingPlugingTest thirdTest("differentGroupName", &fourthTest);
    UtestForMemoryReportingPlugingTest secondTest("groupname", &thirdTest);
    UtestForMemoryReportingPlugingTest firstTest("groupname", &secondTest);

    mock("formatter").expectOneCall("report_testgroup_end").withParameter("result", result).withParameter("test", &secondTest);
    mock("formatter").ignoreOtherCalls();

    reporter->preTestAction(firstTest, *result);
    reporter->postTestAction(firstTest, *result);
    reporter->preTestAction(secondTest, *result);
    reporter->postTestAction(secondTest, *result);
    reporter->preTestAction(thirdTest, *result);
    reporter->postTestAction(thirdTest, *result);
}